

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::Difference>::reset
          (IdBlockBase<mathiu::impl::Difference> *this,int32_t depth)

{
  undefined1 local_41;
  ValueVariant<mathiu::impl::Difference> *local_40;
  _Variadic_union<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  local_38;
  undefined8 local_18;
  
  if (depth <= this->mDepth) {
    local_40 = &this->mVariant;
    local_38._16_8_ = 0;
    local_38._24_8_ = 0;
    local_38._M_rest._M_rest =
         (_Variadic_union<mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>)0x0;
    local_38._8_8_ = 0;
    local_18 = 0;
    std::operator=(&local_40,&local_38,&local_41);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                         *)&local_38);
    this->mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }